

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O2

REF_STATUS ref_list_inspect(REF_LIST ref_list)

{
  REF_STATUS RVar1;
  ulong uVar2;
  
  if (ref_list == (REF_LIST)0x0) {
    RVar1 = 2;
  }
  else {
    RVar1 = 0;
    printf("list has %d items\n",(ulong)(uint)ref_list->n);
    for (uVar2 = 0; (long)uVar2 < (long)ref_list->n; uVar2 = uVar2 + 1) {
      printf("value[%d] = %d\n",uVar2 & 0xffffffff,(ulong)(uint)ref_list->value[uVar2]);
    }
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_list_inspect(REF_LIST ref_list) {
  REF_INT i;

  if (NULL == (void *)ref_list) return REF_NULL;

  printf("list has %d items\n", ref_list_n(ref_list));
  for (i = 0; i < ref_list_n(ref_list); i++)
    printf("value[%d] = %d\n", i, ref_list->value[i]);

  return REF_SUCCESS;
}